

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_point_2d * mg_point_2d_copy_ca(mg_point_2d *src,mg_allocator *allocator)

{
  double dVar1;
  mg_point_2d *pmVar2;
  
  if ((src != (mg_point_2d *)0x0) &&
     (pmVar2 = (mg_point_2d *)mg_allocator_malloc(allocator,0x18), pmVar2 != (mg_point_2d *)0x0)) {
    pmVar2->y = src->y;
    dVar1 = src->x;
    pmVar2->srid = src->srid;
    pmVar2->x = dVar1;
    return pmVar2;
  }
  return (mg_point_2d *)0x0;
}

Assistant:

mg_point_2d *mg_point_2d_copy_ca(const mg_point_2d *src,
                                 mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_point_2d *point_2d = mg_point_2d_alloc(allocator);
  if (!point_2d) {
    return NULL;
  }
  memcpy(point_2d, src, sizeof(mg_point_2d));
  return point_2d;
}